

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O1

bool __thiscall cppnet::RWSocket::Write(RWSocket *this,char *src,uint32_t len)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  _func_int **pp_Var4;
  element_type *peVar5;
  element_type *peVar6;
  undefined1 uVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar11;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  Event *pEVar10;
  
  if (this->_event == (Event *)0x0) {
    peVar2 = (((this->_alloter).super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar8 = (*peVar2->_vptr_Alloter[3])(peVar2,0x28);
    pEVar10 = (Event *)CONCAT44(extraout_var,iVar8);
    if (pEVar10 == (Event *)0x0) {
      pEVar10 = (Event *)0x0;
    }
    else {
      pEVar10->_vptr_Event = (_func_int **)&PTR__Event_001240a8;
      pEVar10->_data = (void *)0x0;
      pEVar10->_event_type = 0;
      (pEVar10->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pEVar10->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    this->_event = pEVar10;
    std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppnet::RWSocket,void>
              ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&local_50,
               (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<cppnet::RWSocket>);
    peVar6 = local_50;
    local_40 = local_50;
    local_38._M_pi = p_Stack_48;
    local_50 = (element_type *)0x0;
    p_Stack_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pEVar10->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pEVar10->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_38);
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
    if (p_Stack_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_48);
    }
  }
  iVar8 = (*(((this->_write_buffer).
              super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
  peVar3 = (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pp_Var4 = (peVar3->super_InnerBuffer).super_Buffer._vptr_Buffer;
  if (iVar8 == 0) {
    (*pp_Var4[10])(peVar3,src,(ulong)len);
    uVar7 = Send(this);
  }
  else {
    uVar9 = (*pp_Var4[8])();
    if (uVar9 < 0x400001) {
      peVar3 = (this->_write_buffer).
               super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar3->super_InnerBuffer).super_Buffer._vptr_Buffer[10])(peVar3,src,(ulong)len);
      this_00 = (this->super_Socket)._event_actions.
                super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar8 = this_00->_M_use_count;
        do {
          if (iVar8 == 0) {
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            break;
          }
          LOCK();
          iVar1 = this_00->_M_use_count;
          bVar11 = iVar8 == iVar1;
          if (bVar11) {
            this_00->_M_use_count = iVar8 + 1;
            iVar1 = iVar8;
          }
          iVar8 = iVar1;
          UNLOCK();
        } while (!bVar11);
      }
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar11 = true;
      }
      else {
        bVar11 = this_00->_M_use_count == 0;
      }
      peVar5 = (this->super_Socket)._event_actions.
               super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar5 == (element_type *)0x0 || bVar11) {
        uVar7 = 0;
      }
      else {
        iVar8 = (*peVar5->_vptr_EventActions[4])(peVar5,this->_event);
        uVar7 = (undefined1)iVar8;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    else {
      uVar7 = 0;
    }
  }
  return (bool)uVar7;
}

Assistant:

bool RWSocket::Write(const char* src, uint32_t len) {
    if (!_event) {
        _event = _alloter->PoolNew<Event>();
        _event->SetSocket(shared_from_this());
    }

    //can't send now
    if (_write_buffer->GetCanReadLength() > 0) {
        if (_write_buffer->GetCanReadLength() > __max_write_cache) {
            return false;
        }
        
        _write_buffer->Write(src, len);
        auto actions = GetEventActions();
        if (actions) {
            return actions->AddSendEvent(_event);
        }
        return false;

    } else {
        _write_buffer->Write(src, len);
        return Send();
    }
}